

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCountUtf8BytesFromStr(ImWchar *in_text,ImWchar *in_text_end)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  uint c;
  int bytes_count;
  ImWchar *in_text_end_local;
  ImWchar *in_text_local;
  
  local_1c = 0;
  in_text_end_local = in_text;
  while( true ) {
    if ((in_text_end == (ImWchar *)0x0) || (bVar2 = false, in_text_end_local < in_text_end)) {
      bVar2 = *in_text_end_local != 0;
    }
    if (!bVar2) break;
    if (*in_text_end_local < 0x80) {
      local_1c = local_1c + 1;
      in_text_end_local = in_text_end_local + 1;
    }
    else {
      iVar1 = ImTextCountUtf8BytesFromChar(*in_text_end_local);
      local_1c = iVar1 + local_1c;
      in_text_end_local = in_text_end_local + 1;
    }
  }
  return local_1c;
}

Assistant:

int ImTextCountUtf8BytesFromStr(const ImWchar* in_text, const ImWchar* in_text_end)
{
    int bytes_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            bytes_count++;
        else
            bytes_count += ImTextCountUtf8BytesFromChar(c);
    }
    return bytes_count;
}